

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error FT_Glyph_Copy(FT_Glyph source,FT_Glyph *target)

{
  FT_Glyph_Class *clazz_00;
  FT_Glyph_Class *clazz;
  FT_Library pFStack_20;
  FT_Error error;
  FT_Glyph copy;
  FT_Glyph *target_local;
  FT_Glyph source_local;
  
  if (((target == (FT_Glyph *)0x0) || (source == (FT_Glyph)0x0)) ||
     (source->clazz == (FT_Glyph_Class *)0x0)) {
    clazz._4_4_ = 6;
  }
  else {
    *target = (FT_Glyph)0x0;
    if ((source == (FT_Glyph)0x0) || (source->clazz == (FT_Glyph_Class *)0x0)) {
      clazz._4_4_ = 6;
    }
    else {
      clazz_00 = source->clazz;
      copy = (FT_Glyph)target;
      target_local = (FT_Glyph *)source;
      clazz._4_4_ = ft_new_glyph(source->library,clazz_00,(FT_Glyph *)&stack0xffffffffffffffe0);
      if (clazz._4_4_ == 0) {
        ((FT_Vector *)pFStack_20->modules)->x = (FT_Pos)target_local[3];
        ((FT_Vector *)pFStack_20->modules)->y = (FT_Pos)target_local[4];
        pFStack_20->version_patch = *(FT_Glyph_Format *)(target_local + 2);
        if (clazz_00->glyph_copy != (FT_Glyph_CopyFunc)0x0) {
          clazz._4_4_ = (*clazz_00->glyph_copy)((FT_Glyph)target_local,(FT_Glyph)pFStack_20);
        }
        if (clazz._4_4_ == 0) {
          copy->library = pFStack_20;
        }
        else {
          FT_Done_Glyph((FT_Glyph)pFStack_20);
        }
      }
    }
  }
  return clazz._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Glyph_Copy( FT_Glyph   source,
                 FT_Glyph  *target )
  {
    FT_Glyph               copy;
    FT_Error               error;
    const FT_Glyph_Class*  clazz;


    /* check arguments */
    if ( !target || !source || !source->clazz )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    *target = NULL;

    if ( !source || !source->clazz )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    clazz = source->clazz;
    error = ft_new_glyph( source->library, clazz, &copy );
    if ( error )
      goto Exit;

    copy->advance = source->advance;
    copy->format  = source->format;

    if ( clazz->glyph_copy )
      error = clazz->glyph_copy( source, copy );

    if ( error )
      FT_Done_Glyph( copy );
    else
      *target = copy;

  Exit:
    return error;
  }